

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  float fVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  ImVec2 local_78;
  bool is_open;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 size;
  ImVec2 pos;
  ImGuiAxis axis;
  ImRect avail_rect;
  ImGuiViewportP *viewport;
  ImGuiWindow *bar_window;
  ImGuiWindowFlags window_flags_local;
  float axis_size_local;
  ImGuiDir dir_local;
  ImGuiViewport *viewport_p_local;
  char *name_local;
  
  if (dir != -1) {
    pIVar3 = FindWindowByName(name);
    local_78 = (ImVec2)viewport_p;
    if (viewport_p == (ImGuiViewport *)0x0) {
      local_78 = (ImVec2)GetMainViewport();
    }
    avail_rect.Max = local_78;
    if ((pIVar3 == (ImGuiWindow *)0x0) || (pIVar3->BeginCount == 0)) {
      join_0x00001240_0x00001200_ = ImGuiViewportP::GetBuildWorkRect((ImGuiViewportP *)local_78);
      pos.x = (float)(uint)(dir == 2 || dir == 3);
      size = stack0xffffffffffffffb8;
      if ((dir == 1) || (dir == 3)) {
        pfVar4 = ImVec2::operator[](&avail_rect.Min,(long)(int)pos.x);
        fVar1 = *pfVar4;
        pfVar4 = ImVec2::operator[](&size,(long)(int)pos.x);
        *pfVar4 = fVar1 - axis_size;
      }
      local_5c = ImRect::GetSize((ImRect *)&pos.y);
      pfVar4 = ImVec2::operator[](&local_5c,(long)(int)pos.x);
      *pfVar4 = axis_size;
      ImVec2::ImVec2(&local_64,0.0,0.0);
      SetNextWindowPos(&size,0,&local_64);
      SetNextWindowSize(&local_5c,0);
      if ((dir == 2) || (dir == 0)) {
        pfVar4 = ImVec2::operator[]((ImVec2 *)((long)avail_rect.Max + 0x120),(long)(int)pos.x);
        *pfVar4 = axis_size + *pfVar4;
      }
      else if ((dir == 3) || (dir == 1)) {
        pfVar4 = ImVec2::operator[]((ImVec2 *)((long)avail_rect.Max + 0x128),(long)(int)pos.x);
        *pfVar4 = *pfVar4 - axis_size;
      }
    }
    SetNextWindowViewport(*(ImGuiID *)avail_rect.Max);
    PushStyleVar(3,0.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,0.0,0.0);
    PushStyleVar(5,(ImVec2 *)&stack0xffffffffffffff94);
    bVar2 = Begin(name,(bool *)0x0,window_flags | 0x200007);
    PopStyleVar(2);
    return bVar2;
  }
  __assert_fail("dir != ImGuiDir_None",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                ,0x1a71,
                "bool ImGui::BeginViewportSideBar(const char *, ImGuiViewport *, ImGuiDir, float, ImGuiWindowFlags)"
               );
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoDocking;
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our own viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}